

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O0

VOID CorUnix::TerminateCurrentProcessNoExit(BOOL bTerminateUnconditionally)

{
  DWORD DVar1;
  DWORD DVar2;
  BOOL BVar3;
  int iVar4;
  int *Destination;
  DWORD old_terminator;
  BOOL locked;
  BOOL bTerminateUnconditionally_local;
  
  Destination = Volatile<int>::operator&(&terminator);
  DVar1 = GetCurrentThreadId();
  DVar1 = InterlockedCompareExchange(Destination,DVar1,0);
  if (DVar1 != 0) {
    DVar2 = GetCurrentThreadId();
    if (DVar2 != DVar1) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      poll((pollfd *)0x0,0,-1);
    }
  }
  BVar3 = PALInitLock();
  if (BVar3 != 0) {
    iVar4 = ::Volatile::operator_cast_to_int((Volatile *)&init_count);
    if (0 < iVar4) {
      PROCCleanupProcess(bTerminateUnconditionally);
    }
  }
  return;
}

Assistant:

VOID
CorUnix::TerminateCurrentProcessNoExit(BOOL bTerminateUnconditionally)
{
    BOOL locked;
    DWORD old_terminator;

    old_terminator = InterlockedCompareExchange(&terminator, GetCurrentThreadId(), 0);

    if (0 != old_terminator && GetCurrentThreadId() != old_terminator)
    {
        /* another thread has already initiated the termination process. we
           could just block on the PALInitLock critical section, but then
           PROCSuspendOtherThreads would hang... so sleep forever here, we're
           terminating anyway

           Update: [TODO] PROCSuspendOtherThreads has been removed. Can this
           code be changed? */

        /* note that if *this* thread has already started the termination
           process, we want to proceed. the only way this can happen is if a
           call to DllMain (from ExitProcess) brought us here (because DllMain
           called ExitProcess, or TerminateProcess, or ExitThread);
           TerminateProcess won't call DllMain, so there's no danger to get
           caught in an infinite loop */
        WARN("termination already started from another thread; blocking.\n");
        poll(NULL, 0, INFTIM);
    }

    /* Try to lock the initialization count to prevent multiple threads from
       terminating/initializing the PAL simultaneously */

    /* note : it's also important to take this lock before the process lock,
       because Init/Shutdown take the init lock, and the functions they call
       may take the process lock. We must do it in the same order to avoid
       deadlocks */
    locked = PALInitLock();
    if(locked && PALIsInitialized())
    {
         PROCCleanupProcess(bTerminateUnconditionally);
     }
}